

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvisci.cpp
# Opt level: O0

void UConverter_toUnicode_ISCII_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  char cVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  UChar *pUVar5;
  UChar *pUVar6;
  ushort *puVar7;
  UConverter *pUVar8;
  int *piVar9;
  bool bVar10;
  UBool UVar11;
  uint uVar12;
  int iVar13;
  uint32_t *puVar14;
  UChar *pUVar15;
  char *pcVar16;
  UConverter *cnv;
  int local_68;
  int offset;
  int i;
  UBool found;
  UChar *contextCharToUnicode;
  UChar32 tempTargetUniChar;
  UChar32 *toUnicodeStatus;
  UConverterDataISCII *data;
  uint8_t sourceChar;
  uint32_t targetUniChar;
  UChar *targetLimit;
  char *sourceLimit;
  UChar *target;
  char *source;
  UErrorCode *err_local;
  UConverterToUnicodeArgs *args_local;
  
  pUVar5 = (UChar *)args->sourceLimit;
  pUVar6 = args->targetLimit;
  if (((args->converter == (UConverter *)0x0) || (args->target < args->target)) ||
     (args->source < args->source)) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    puVar7 = (ushort *)args->converter->extraInfo;
    puVar14 = &args->converter->toUnicodeStatus;
    sourceLimit = (char *)args->target;
    target = (UChar *)args->source;
LAB_003869aa:
    UVar11 = U_SUCCESS(*err);
    if (UVar11 != '\0' && target < pUVar5) {
      data._4_4_ = 0xffff;
      if (pUVar6 <= sourceLimit) {
        *err = U_BUFFER_OVERFLOW_ERROR;
        goto LAB_003882a0;
      }
      pUVar15 = (UChar *)((long)target + 1);
      bVar1 = (byte)*target;
      target = pUVar15;
      if (*puVar7 == 0xef) {
        if ((byte)(0x4b - bVar1) < 10) {
          puVar7[4] = lookupTable[(int)(bVar1 & 0xf)][0] << 7;
          *(uint *)(puVar7 + 8) = (uint)lookupTable[(int)(bVar1 & 0xf)][1];
        }
        else if (bVar1 == 0x40) {
          puVar7[4] = puVar7[2];
          *(undefined4 *)(puVar7 + 8) = *(undefined4 *)(puVar7 + 10);
        }
        else if ((bVar1 < 0x21) || (0x3f < bVar1)) {
          *err = U_ILLEGAL_CHAR_FOUND;
          *puVar7 = 0xfffe;
          goto LAB_00388271;
        }
        *puVar7 = 0xfffe;
        goto LAB_003869aa;
      }
      iVar13 = (int)pUVar15;
      if (*puVar7 != 0xf0) {
        if (*puVar7 == 0xd9) {
          if (bVar1 == 0xe8) {
            data._4_4_ = 0x20;
          }
          else {
            data._4_4_ = 0x200d;
          }
          if (*(int *)(puVar7 + 0x16) != 0) {
            if (((0xa0 < *(int *)(puVar7 + 0x16)) && (*(int *)(puVar7 + 0x16) != 0x200d)) &&
               ((*(int *)(puVar7 + 0x16) != 0x200c &&
                ((*(int *)(puVar7 + 0x16) != 0x964 && (*(int *)(puVar7 + 0x16) != 0x965)))))) {
              *(undefined4 *)(puVar7 + 0x16) = *(undefined4 *)(puVar7 + 0x16);
            }
            if (sourceLimit < args->targetLimit) {
              pcVar16 = sourceLimit + 2;
              *(short *)sourceLimit = (short)*(undefined4 *)(puVar7 + 0x16);
              sourceLimit = pcVar16;
              if (args->offsets != (int32_t *)0x0) {
                piVar9 = args->offsets;
                args->offsets = piVar9 + 1;
                *piVar9 = (iVar13 - (int)args->source) + -1;
              }
            }
            else {
              uVar3 = *(undefined4 *)(puVar7 + 0x16);
              pUVar8 = args->converter;
              cVar2 = args->converter->UCharErrorBufferLength;
              args->converter->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar3;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
            puVar7[0x16] = 0;
            puVar7[0x17] = 0;
          }
          if ((((0xa0 < data._4_4_) && (data._4_4_ != 0x200d)) && (data._4_4_ != 0x200c)) &&
             ((data._4_4_ != 0x964 && (data._4_4_ != 0x965)))) {
            data._4_4_ = puVar7[4] + data._4_4_;
          }
          if (sourceLimit < args->targetLimit) {
            pcVar16 = sourceLimit + 2;
            *(UChar *)sourceLimit = (UChar)data._4_4_;
            sourceLimit = pcVar16;
            if (args->offsets != (int32_t *)0x0) {
              piVar9 = args->offsets;
              args->offsets = piVar9 + 1;
              *piVar9 = (iVar13 - (int)args->source) + -2;
            }
          }
          else {
            pUVar8 = args->converter;
            cVar2 = args->converter->UCharErrorBufferLength;
            args->converter->UCharErrorBufferLength = cVar2 + '\x01';
            pUVar8->UCharErrorBuffer[cVar2] = (UChar)data._4_4_;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          *puVar7 = 0xfffe;
        }
        if ((bVar1 == 10) || (bVar1 == 0xd)) {
          *(undefined1 *)((long)puVar7 + 0x19) = 1;
          data._4_4_ = (uint)toUnicodeTable[bVar1];
          if (((0xa0 < bVar1) && (((uint)""[data._4_4_ & 0x7f] & *(uint *)(puVar7 + 8)) == 0)) &&
             ((puVar7[4] != 0x300 || (data._4_4_ != 0x931)))) {
            data._4_4_ = 0xffff;
          }
          *puVar7 = (ushort)bVar1;
        }
        else {
          if (bVar1 == 0xd9) {
LAB_00386ff6:
            *puVar7 = (ushort)bVar1;
            if (*puVar14 != 0xffff) {
              if (*(int *)(puVar7 + 0x16) != 0) {
                if ((((0xa0 < *(int *)(puVar7 + 0x16)) && (*(int *)(puVar7 + 0x16) != 0x200d)) &&
                    (*(int *)(puVar7 + 0x16) != 0x200c)) &&
                   ((*(int *)(puVar7 + 0x16) != 0x964 && (*(int *)(puVar7 + 0x16) != 0x965)))) {
                  *(undefined4 *)(puVar7 + 0x16) = *(undefined4 *)(puVar7 + 0x16);
                }
                if (sourceLimit < args->targetLimit) {
                  pcVar16 = sourceLimit + 2;
                  *(short *)sourceLimit = (short)*(undefined4 *)(puVar7 + 0x16);
                  sourceLimit = pcVar16;
                  if (args->offsets != (int32_t *)0x0) {
                    piVar9 = args->offsets;
                    args->offsets = piVar9 + 1;
                    *piVar9 = (iVar13 - (int)args->source) + -1;
                  }
                }
                else {
                  uVar3 = *(undefined4 *)(puVar7 + 0x16);
                  pUVar8 = args->converter;
                  cVar2 = args->converter->UCharErrorBufferLength;
                  args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                  pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar3;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
                puVar7[0x16] = 0;
                puVar7[0x17] = 0;
              }
              if (((0xa0 < (int)*puVar14) && (*puVar14 != 0x200d)) &&
                 ((*puVar14 != 0x200c && ((*puVar14 != 0x964 && (*puVar14 != 0x965)))))) {
                *puVar14 = (uint)puVar7[4] + *puVar14;
              }
              if (sourceLimit < args->targetLimit) {
                pcVar16 = sourceLimit + 2;
                *(short *)sourceLimit = (short)*puVar14;
                sourceLimit = pcVar16;
                if (args->offsets != (int32_t *)0x0) {
                  piVar9 = args->offsets;
                  args->offsets = piVar9 + 1;
                  *piVar9 = (iVar13 - (int)args->source) + -2;
                }
              }
              else {
                uVar4 = *puVar14;
                pUVar8 = args->converter;
                cVar2 = args->converter->UCharErrorBufferLength;
                args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar4;
                *err = U_BUFFER_OVERFLOW_ERROR;
              }
              *puVar14 = 0xffff;
            }
            goto LAB_003869aa;
          }
          if (bVar1 == 0xe0) {
            bVar10 = false;
            for (local_68 = 1; local_68 < 2; local_68 = local_68 + 1) {
              if (vowelSignESpecialCases[local_68][0] == (*puVar7 & 0xff)) {
                data._4_4_ = (uint)vowelSignESpecialCases[local_68][1];
                bVar10 = true;
                break;
              }
            }
            if ((bVar10) && (((uint)""[data._4_4_ & 0xff] & *(uint *)(puVar7 + 8)) != 0)) {
              *puVar7 = 0xfffe;
              *puVar14 = 0xffff;
            }
            else {
              data._4_4_ = 0x946;
              if ((*(uint *)(puVar7 + 8) & 0x87) == 0) {
                data._4_4_ = 0xffff;
              }
              *puVar7 = 0xe0;
            }
          }
          else if (bVar1 == 0xe8) {
            if (*puVar7 == 0xe8) {
              data._4_4_ = 0x200c;
              *puVar7 = 0xfffe;
            }
            else {
              data._4_4_ = 0x94d;
              if ((*(uint *)(puVar7 + 8) & 0xff) == 0) {
                data._4_4_ = 0xffff;
              }
              *puVar7 = 0xe8;
            }
          }
          else if (bVar1 == 0xe9) {
            if (*puVar7 == 0xe8) {
              data._4_4_ = 0x200d;
              *puVar7 = 0xfffe;
            }
            else {
              if ((puVar7[4] == 0x100) && (*puVar7 == 0xc0)) {
                if (*(int *)(puVar7 + 0x16) != 0) {
                  if ((((0xa0 < *(int *)(puVar7 + 0x16)) && (*(int *)(puVar7 + 0x16) != 0x200d)) &&
                      (*(int *)(puVar7 + 0x16) != 0x200c)) &&
                     ((*(int *)(puVar7 + 0x16) != 0x964 && (*(int *)(puVar7 + 0x16) != 0x965)))) {
                    *(undefined4 *)(puVar7 + 0x16) = *(undefined4 *)(puVar7 + 0x16);
                  }
                  if (sourceLimit < args->targetLimit) {
                    pcVar16 = sourceLimit + 2;
                    *(short *)sourceLimit = (short)*(undefined4 *)(puVar7 + 0x16);
                    sourceLimit = pcVar16;
                    if (args->offsets != (int32_t *)0x0) {
                      piVar9 = args->offsets;
                      args->offsets = piVar9 + 1;
                      *piVar9 = (iVar13 - (int)args->source) + -1;
                    }
                  }
                  else {
                    uVar3 = *(undefined4 *)(puVar7 + 0x16);
                    pUVar8 = args->converter;
                    cVar2 = args->converter->UCharErrorBufferLength;
                    args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                    pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar3;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                  }
                  puVar7[0x16] = 0;
                  puVar7[0x17] = 0;
                }
                if (sourceLimit < args->targetLimit) {
                  pcVar16 = sourceLimit + 2;
                  sourceLimit[0] = '\\';
                  sourceLimit[1] = '\n';
                  sourceLimit = pcVar16;
                  if (args->offsets != (int32_t *)0x0) {
                    piVar9 = args->offsets;
                    args->offsets = piVar9 + 1;
                    *piVar9 = (iVar13 - (int)args->source) + -2;
                  }
                }
                else {
                  pUVar8 = args->converter;
                  cVar2 = args->converter->UCharErrorBufferLength;
                  args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                  pUVar8->UCharErrorBuffer[cVar2] = L'ੜ';
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
                UVar11 = U_SUCCESS(*err);
                if (UVar11 == '\0') {
                  pUVar8 = args->converter;
                  cVar2 = args->converter->UCharErrorBufferLength;
                  args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                  pUVar8->UCharErrorBuffer[cVar2] = L'੍';
                  pUVar8 = args->converter;
                  cVar2 = args->converter->UCharErrorBufferLength;
                  args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                  pUVar8->UCharErrorBuffer[cVar2] = L'ਹ';
                }
                else {
                  if (sourceLimit < args->targetLimit) {
                    pcVar16 = sourceLimit + 2;
                    sourceLimit[0] = 'M';
                    sourceLimit[1] = '\n';
                    sourceLimit = pcVar16;
                    if (args->offsets != (int32_t *)0x0) {
                      piVar9 = args->offsets;
                      args->offsets = piVar9 + 1;
                      *piVar9 = (iVar13 - (int)args->source) + -2;
                    }
                  }
                  else {
                    pUVar8 = args->converter;
                    cVar2 = args->converter->UCharErrorBufferLength;
                    args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                    pUVar8->UCharErrorBuffer[cVar2] = L'੍';
                    *err = U_BUFFER_OVERFLOW_ERROR;
                  }
                  UVar11 = U_SUCCESS(*err);
                  if (UVar11 == '\0') {
                    pUVar8 = args->converter;
                    cVar2 = args->converter->UCharErrorBufferLength;
                    args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                    pUVar8->UCharErrorBuffer[cVar2] = L'ਹ';
                  }
                  else if (sourceLimit < args->targetLimit) {
                    pcVar16 = sourceLimit + 2;
                    sourceLimit[0] = '9';
                    sourceLimit[1] = '\n';
                    sourceLimit = pcVar16;
                    if (args->offsets != (int32_t *)0x0) {
                      piVar9 = args->offsets;
                      args->offsets = piVar9 + 1;
                      *piVar9 = (iVar13 - (int)args->source) + -2;
                    }
                  }
                  else {
                    pUVar8 = args->converter;
                    cVar2 = args->converter->UCharErrorBufferLength;
                    args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                    pUVar8->UCharErrorBuffer[cVar2] = L'ਹ';
                    *err = U_BUFFER_OVERFLOW_ERROR;
                  }
                }
                *puVar14 = 0xffff;
                *puVar7 = 0xfffe;
                goto LAB_003869aa;
              }
              bVar10 = false;
              for (local_68 = 1; local_68 < 0x10; local_68 = local_68 + 1) {
                if (nuktaSpecialCases[local_68][0] == (*puVar7 & 0xff)) {
                  data._4_4_ = (uint)nuktaSpecialCases[local_68][1];
                  bVar10 = true;
                  break;
                }
              }
              if ((!bVar10) || (((uint)""[data._4_4_ & 0xff] & *(uint *)(puVar7 + 8)) == 0))
              goto LAB_00387bf5;
              *puVar7 = 0xfffe;
              *puVar14 = 0xffff;
              if (puVar7[4] == 0x100) {
                if (*(int *)(puVar7 + 0x16) != 0) {
                  if ((((0xa0 < *(int *)(puVar7 + 0x16)) && (*(int *)(puVar7 + 0x16) != 0x200d)) &&
                      (*(int *)(puVar7 + 0x16) != 0x200c)) &&
                     ((*(int *)(puVar7 + 0x16) != 0x964 && (*(int *)(puVar7 + 0x16) != 0x965)))) {
                    *(undefined4 *)(puVar7 + 0x16) = *(undefined4 *)(puVar7 + 0x16);
                  }
                  if (sourceLimit < args->targetLimit) {
                    pcVar16 = sourceLimit + 2;
                    *(short *)sourceLimit = (short)*(undefined4 *)(puVar7 + 0x16);
                    sourceLimit = pcVar16;
                    if (args->offsets != (int32_t *)0x0) {
                      piVar9 = args->offsets;
                      args->offsets = piVar9 + 1;
                      *piVar9 = (iVar13 - (int)args->source) + -1;
                    }
                  }
                  else {
                    uVar3 = *(undefined4 *)(puVar7 + 0x16);
                    pUVar8 = args->converter;
                    cVar2 = args->converter->UCharErrorBufferLength;
                    args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                    pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar3;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                  }
                  puVar7[0x16] = 0;
                  puVar7[0x17] = 0;
                }
                if (((0xa0 < data._4_4_) && (data._4_4_ != 0x200d)) &&
                   ((data._4_4_ != 0x200c && ((data._4_4_ != 0x964 && (data._4_4_ != 0x965)))))) {
                  data._4_4_ = puVar7[4] + data._4_4_;
                }
                if (sourceLimit < args->targetLimit) {
                  pcVar16 = sourceLimit + 2;
                  *(UChar *)sourceLimit = (UChar)data._4_4_;
                  sourceLimit = pcVar16;
                  if (args->offsets != (int32_t *)0x0) {
                    piVar9 = args->offsets;
                    args->offsets = piVar9 + 1;
                    *piVar9 = (iVar13 - (int)args->source) + -2;
                  }
                }
                else {
                  pUVar8 = args->converter;
                  cVar2 = args->converter->UCharErrorBufferLength;
                  args->converter->UCharErrorBufferLength = cVar2 + '\x01';
                  pUVar8->UCharErrorBuffer[cVar2] = (UChar)data._4_4_;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
                goto LAB_003869aa;
              }
            }
          }
          else if (bVar1 == 0xea) {
            if (*puVar7 == 0xea) {
              data._4_4_ = 0x965;
              *puVar7 = 0xfffe;
              *puVar14 = 0xffff;
            }
            else {
              data._4_4_ = 0x964;
              if ((*(uint *)(puVar7 + 8) & 0x80) == 0) {
                data._4_4_ = 0xffff;
              }
              *puVar7 = 0xea;
            }
          }
          else {
            if (bVar1 == 0xef || bVar1 == 0xf0) goto LAB_00386ff6;
LAB_00387bf5:
            data._4_4_ = (uint)toUnicodeTable[bVar1];
            if (((0xa0 < bVar1) && (((uint)""[data._4_4_ & 0x7f] & *(uint *)(puVar7 + 8)) == 0)) &&
               ((puVar7[4] != 0x300 || (data._4_4_ != 0x931)))) {
              data._4_4_ = 0xffff;
            }
            *puVar7 = (ushort)bVar1;
          }
        }
        if (*puVar14 != 0xffff) {
          if (((puVar7[4] == 0x100) && (*(int *)(puVar7 + 0x16) != 0)) &&
             ((UVar11 = isPNJConsonant(*(UChar32 *)(puVar7 + 0x16)), UVar11 != '\0' &&
              ((*puVar14 == 0x94d && (data._4_4_ + 0x100 == *(int *)(puVar7 + 0x16))))))) {
            iVar13 = (iVar13 - (int)args->source) + -3;
            if (sourceLimit < args->targetLimit) {
              pcVar16 = sourceLimit + 2;
              sourceLimit[0] = 'q';
              sourceLimit[1] = '\n';
              sourceLimit = pcVar16;
              if (args->offsets != (int32_t *)0x0) {
                piVar9 = args->offsets;
                args->offsets = piVar9 + 1;
                *piVar9 = iVar13;
              }
            }
            else {
              pUVar8 = args->converter;
              cVar2 = args->converter->UCharErrorBufferLength;
              args->converter->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar8->UCharErrorBuffer[cVar2] = L'ੱ';
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
            if ((((0xa0 < *(int *)(puVar7 + 0x16)) && (*(int *)(puVar7 + 0x16) != 0x200d)) &&
                (*(int *)(puVar7 + 0x16) != 0x200c)) &&
               ((*(int *)(puVar7 + 0x16) != 0x964 && (*(int *)(puVar7 + 0x16) != 0x965)))) {
              *(undefined4 *)(puVar7 + 0x16) = *(undefined4 *)(puVar7 + 0x16);
            }
            if (sourceLimit < args->targetLimit) {
              pcVar16 = sourceLimit + 2;
              *(short *)sourceLimit = (short)*(undefined4 *)(puVar7 + 0x16);
              sourceLimit = pcVar16;
              if (args->offsets != (int32_t *)0x0) {
                piVar9 = args->offsets;
                args->offsets = piVar9 + 1;
                *piVar9 = iVar13;
              }
            }
            else {
              uVar3 = *(undefined4 *)(puVar7 + 0x16);
              pUVar8 = args->converter;
              cVar2 = args->converter->UCharErrorBufferLength;
              args->converter->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar3;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
            puVar7[0x16] = 0;
            puVar7[0x17] = 0;
            *puVar14 = 0xffff;
            goto LAB_003869aa;
          }
          if (*(int *)(puVar7 + 0x16) != 0) {
            if (((0xa0 < *(int *)(puVar7 + 0x16)) && (*(int *)(puVar7 + 0x16) != 0x200d)) &&
               ((*(int *)(puVar7 + 0x16) != 0x200c &&
                ((*(int *)(puVar7 + 0x16) != 0x964 && (*(int *)(puVar7 + 0x16) != 0x965)))))) {
              *(undefined4 *)(puVar7 + 0x16) = *(undefined4 *)(puVar7 + 0x16);
            }
            if (sourceLimit < args->targetLimit) {
              pcVar16 = sourceLimit + 2;
              *(short *)sourceLimit = (short)*(undefined4 *)(puVar7 + 0x16);
              sourceLimit = pcVar16;
              if (args->offsets != (int32_t *)0x0) {
                piVar9 = args->offsets;
                args->offsets = piVar9 + 1;
                *piVar9 = (iVar13 - (int)args->source) + -1;
              }
            }
            else {
              uVar3 = *(undefined4 *)(puVar7 + 0x16);
              pUVar8 = args->converter;
              cVar2 = args->converter->UCharErrorBufferLength;
              args->converter->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar3;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
            puVar7[0x16] = 0;
            puVar7[0x17] = 0;
          }
          if (((puVar7[4] == 0x100) && (data._4_4_ == 0x902)) &&
             (UVar11 = isPNJBindiTippi(*puVar14 + 0x100), UVar11 != '\0')) {
            data._4_4_ = 0x970;
            if ((((0xa0 < (int)*puVar14) && (*puVar14 != 0x200d)) && (*puVar14 != 0x200c)) &&
               ((*puVar14 != 0x964 && (*puVar14 != 0x965)))) {
              *puVar14 = *puVar14 + 0x100;
            }
            if (sourceLimit < args->targetLimit) {
              pcVar16 = sourceLimit + 2;
              *(short *)sourceLimit = (short)*puVar14;
              sourceLimit = pcVar16;
              if (args->offsets != (int32_t *)0x0) {
                piVar9 = args->offsets;
                args->offsets = piVar9 + 1;
                *piVar9 = (iVar13 - (int)args->source) + -2;
              }
            }
            else {
              uVar4 = *puVar14;
              pUVar8 = args->converter;
              cVar2 = args->converter->UCharErrorBufferLength;
              args->converter->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar4;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
          }
          else if (((puVar7[4] == 0x100) && (data._4_4_ == 0x94d)) &&
                  (UVar11 = isPNJConsonant(*puVar14 + 0x100), UVar11 != '\0')) {
            *(uint32_t *)(puVar7 + 0x16) = *puVar14 + 0x100;
          }
          else {
            if (((0xa0 < (int)*puVar14) && (*puVar14 != 0x200d)) &&
               ((*puVar14 != 0x200c && ((*puVar14 != 0x964 && (*puVar14 != 0x965)))))) {
              *puVar14 = (uint)puVar7[4] + *puVar14;
            }
            if (sourceLimit < args->targetLimit) {
              pcVar16 = sourceLimit + 2;
              *(short *)sourceLimit = (short)*puVar14;
              sourceLimit = pcVar16;
              if (args->offsets != (int32_t *)0x0) {
                piVar9 = args->offsets;
                args->offsets = piVar9 + 1;
                *piVar9 = (iVar13 - (int)args->source) + -2;
              }
            }
            else {
              uVar4 = *puVar14;
              pUVar8 = args->converter;
              cVar2 = args->converter->UCharErrorBufferLength;
              args->converter->UCharErrorBufferLength = cVar2 + '\x01';
              pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar4;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
          }
          *puVar14 = 0xffff;
        }
        if (data._4_4_ == 0xffff) {
          *err = U_INVALID_CHAR_FOUND;
LAB_00388271:
          args->converter->toUBytes[0] = bVar1;
          args->converter->toULength = '\x01';
          goto LAB_003882a0;
        }
        *puVar14 = data._4_4_ & 0xffff;
        if (*(char *)((long)puVar7 + 0x19) == '\x01') {
          puVar7[4] = puVar7[2];
          *(undefined4 *)(puVar7 + 8) = *(undefined4 *)(puVar7 + 10);
          *(undefined1 *)((long)puVar7 + 0x19) = 0;
        }
        goto LAB_003869aa;
      }
      if (0x4d < (byte)(0xee - bVar1)) {
        *puVar7 = 0xfffe;
        *err = U_ILLEGAL_CHAR_FOUND;
        goto LAB_00388271;
      }
      if ((bVar1 != 0xbf) && (bVar1 != 0xb8)) {
LAB_00386d3a:
        *err = U_INVALID_CHAR_FOUND;
        goto LAB_00388271;
      }
      uVar12 = 0x952;
      if (bVar1 == 0xbf) {
        uVar12 = 0x970;
      }
      data._4_2_ = (UChar)uVar12;
      if (((uint)""[uVar12 & 0xff] & *(uint *)(puVar7 + 8)) == 0) goto LAB_00386d3a;
      *puVar7 = 0xfffe;
      if (*(int *)(puVar7 + 0x16) != 0) {
        if (((0xa0 < *(int *)(puVar7 + 0x16)) && (*(int *)(puVar7 + 0x16) != 0x200d)) &&
           ((*(int *)(puVar7 + 0x16) != 0x200c &&
            ((*(int *)(puVar7 + 0x16) != 0x964 && (*(int *)(puVar7 + 0x16) != 0x965)))))) {
          *(undefined4 *)(puVar7 + 0x16) = *(undefined4 *)(puVar7 + 0x16);
        }
        if (sourceLimit < args->targetLimit) {
          pcVar16 = sourceLimit + 2;
          *(short *)sourceLimit = (short)*(undefined4 *)(puVar7 + 0x16);
          sourceLimit = pcVar16;
          if (args->offsets != (int32_t *)0x0) {
            piVar9 = args->offsets;
            args->offsets = piVar9 + 1;
            *piVar9 = (iVar13 - (int)args->source) + -1;
          }
        }
        else {
          uVar3 = *(undefined4 *)(puVar7 + 0x16);
          pUVar8 = args->converter;
          cVar2 = args->converter->UCharErrorBufferLength;
          args->converter->UCharErrorBufferLength = cVar2 + '\x01';
          pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar3;
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        puVar7[0x16] = 0;
        puVar7[0x17] = 0;
      }
      if ((((0xa0 < uVar12) && (uVar12 != 0x200d)) && (uVar12 != 0x200c)) &&
         ((uVar12 != 0x964 && (uVar12 != 0x965)))) {
        data._4_2_ = puVar7[4] + data._4_2_;
      }
      if (sourceLimit < args->targetLimit) {
        pcVar16 = sourceLimit + 2;
        *(UChar *)sourceLimit = data._4_2_;
        sourceLimit = pcVar16;
        if (args->offsets != (int32_t *)0x0) {
          piVar9 = args->offsets;
          args->offsets = piVar9 + 1;
          *piVar9 = (iVar13 - (int)args->source) + -2;
        }
      }
      else {
        pUVar8 = args->converter;
        cVar2 = args->converter->UCharErrorBufferLength;
        args->converter->UCharErrorBufferLength = cVar2 + '\x01';
        pUVar8->UCharErrorBuffer[cVar2] = data._4_2_;
        *err = U_BUFFER_OVERFLOW_ERROR;
      }
      goto LAB_003869aa;
    }
LAB_003882a0:
    UVar11 = U_SUCCESS(*err);
    if (((UVar11 != '\0') && (args->flush != '\0')) && (target == pUVar5)) {
      pUVar8 = args->converter;
      if (((*puVar7 == 0xef) || (*puVar7 == 0xf0)) || (*puVar7 == 0xd9)) {
        pUVar8->toUBytes[0] = (uint8_t)*puVar7;
        pUVar8->toULength = '\x01';
        *puVar7 = 0xfffe;
      }
      else {
        pUVar8->toULength = '\0';
      }
      if (*puVar14 != 0xffff) {
        if (((0xa0 < (int)*puVar14) && (*puVar14 != 0x200d)) &&
           ((*puVar14 != 0x200c && ((*puVar14 != 0x964 && (*puVar14 != 0x965)))))) {
          *puVar14 = (uint)puVar7[4] + *puVar14;
        }
        if (sourceLimit < args->targetLimit) {
          pcVar16 = sourceLimit + 2;
          *(short *)sourceLimit = (short)*puVar14;
          sourceLimit = pcVar16;
          if (args->offsets != (int32_t *)0x0) {
            piVar9 = args->offsets;
            args->offsets = piVar9 + 1;
            *piVar9 = ((int)target - (int)args->source) + -1;
          }
        }
        else {
          uVar4 = *puVar14;
          pUVar8 = args->converter;
          cVar2 = args->converter->UCharErrorBufferLength;
          args->converter->UCharErrorBufferLength = cVar2 + '\x01';
          pUVar8->UCharErrorBuffer[cVar2] = (UChar)uVar4;
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        *puVar14 = 0xffff;
      }
    }
    args->target = (UChar *)sourceLimit;
    args->source = (char *)target;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISCII_OFFSETS_LOGIC(UConverterToUnicodeArgs *args, UErrorCode* err) {
    const char *source = ( char *) args->source;
    UChar *target = args->target;
    const char *sourceLimit = args->sourceLimit;
    const UChar* targetLimit = args->targetLimit;
    uint32_t targetUniChar = 0x0000;
    uint8_t sourceChar = 0x0000;
    UConverterDataISCII* data;
    UChar32* toUnicodeStatus=NULL;
    UChar32 tempTargetUniChar = 0x0000;
    UChar* contextCharToUnicode= NULL;
    UBool found;
    int i; 
    int offset = 0;

    if ((args->converter == NULL) || (target < args->target) || (source < args->source)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    data = (UConverterDataISCII*)(args->converter->extraInfo);
    contextCharToUnicode = &data->contextCharToUnicode; /* contains previous ISCII codepoint visited */
    toUnicodeStatus = (UChar32*)&args->converter->toUnicodeStatus;/* contains the mapping to Unicode of the above codepoint*/

    while (U_SUCCESS(*err) && source<sourceLimit) {

        targetUniChar = missingCharMarker;

        if (target < targetLimit) {
            sourceChar = (unsigned char)*(source)++;

            /* look at the post-context preform special processing */
            if (*contextCharToUnicode==ATR) {

                /* If we have ATR in *contextCharToUnicode then we need to change our
                 * state to the Indic Script specified by sourceChar
                 */

                /* check if the sourceChar is supported script range*/
                if ((uint8_t)(PNJ-sourceChar)<=PNJ-DEV) {
                    data->currentDeltaToUnicode = (uint16_t)(lookupTable[sourceChar & 0x0F][0] * DELTA);
                    data->currentMaskToUnicode = (MaskEnum)lookupTable[sourceChar & 0x0F][1];
                } else if (sourceChar==DEF) {
                    /* switch back to default */
                    data->currentDeltaToUnicode = data->defDeltaToUnicode;
                    data->currentMaskToUnicode = data->defMaskToUnicode;
                } else {
                    if ((sourceChar >= 0x21 && sourceChar <= 0x3F)) {
                        /* these are display codes consume and continue */
                    } else {
                        *err =U_ILLEGAL_CHAR_FOUND;
                        /* reset */
                        *contextCharToUnicode=NO_CHAR_MARKER;
                        goto CALLBACK;
                    }
                }

                /* reset */
                *contextCharToUnicode=NO_CHAR_MARKER;

                continue;

            } else if (*contextCharToUnicode==EXT) {
                /* check if sourceChar is in 0xA1-0xEE range */
                if ((uint8_t) (EXT_RANGE_END - sourceChar) <= (EXT_RANGE_END - EXT_RANGE_BEGIN)) {
                    /* We currently support only Anudatta and Devanagari abbreviation sign */
                    if (sourceChar==0xBF || sourceChar == 0xB8) {
                        targetUniChar = (sourceChar==0xBF) ? DEV_ABBR_SIGN : DEV_ANUDATTA;
                        
                        /* find out if the mapping is valid in this state */
                        if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                            *contextCharToUnicode= NO_CHAR_MARKER;

                            /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                            if (data->prevToUnicodeStatus) {
                                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                                data->prevToUnicodeStatus = 0x0000;
                            }
                            /* write to target */
                            WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);

                            continue;
                        }
                    }
                    /* byte unit is unassigned */
                    targetUniChar = missingCharMarker;
                    *err= U_INVALID_CHAR_FOUND;
                } else {
                    /* only 0xA1 - 0xEE are legal after EXT char */
                    *contextCharToUnicode= NO_CHAR_MARKER;
                    *err = U_ILLEGAL_CHAR_FOUND;
                }
                goto CALLBACK;
            } else if (*contextCharToUnicode==ISCII_INV) {
                if (sourceChar==ISCII_HALANT) {
                    targetUniChar = 0x0020; /* replace with space accoding to Indic FAQ */
                } else {
                    targetUniChar = ZWJ;
                }

                /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                if (data->prevToUnicodeStatus) {
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                    data->prevToUnicodeStatus = 0x0000;
                }
                /* write to target */
                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);
                /* reset */
                *contextCharToUnicode=NO_CHAR_MARKER;
            }

            /* look at the pre-context and perform special processing */
            switch (sourceChar) {
            case ISCII_INV:
            case EXT:
            case ATR:
                *contextCharToUnicode = (UChar)sourceChar;

                if (*toUnicodeStatus != missingCharMarker) {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,data->currentDeltaToUnicode,err);
                    *toUnicodeStatus = missingCharMarker;
                }
                continue;
            case ISCII_DANDA:
                /* handle double danda*/
                if (*contextCharToUnicode== ISCII_DANDA) {
                    targetUniChar = DOUBLE_DANDA;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                    *toUnicodeStatus = missingCharMarker;
                } else {
                    GET_MAPPING(sourceChar,targetUniChar,data);
                    *contextCharToUnicode = sourceChar;
                }
                break;
            case ISCII_HALANT:
                /* handle explicit halant */
                if (*contextCharToUnicode == ISCII_HALANT) {
                    targetUniChar = ZWNJ;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                } else {
                    GET_MAPPING(sourceChar,targetUniChar,data);
                    *contextCharToUnicode = sourceChar;
                }
                break;
            case 0x0A:
            case 0x0D:
                data->resetToDefaultToUnicode = TRUE;
                GET_MAPPING(sourceChar,targetUniChar,data)
                ;
                *contextCharToUnicode = sourceChar;
                break;

            case ISCII_VOWEL_SIGN_E:
                i=1;
                found=FALSE;
                for (; i<vowelSignESpecialCases[0][0]; i++) {
                    U_ASSERT(i<UPRV_LENGTHOF(vowelSignESpecialCases));
                    if (vowelSignESpecialCases[i][0]==(uint8_t)*contextCharToUnicode) {
                        targetUniChar=vowelSignESpecialCases[i][1];
                        found=TRUE;
                        break;
                    }
                }
                if (found) {
                    /* find out if the mapping is valid in this state */
                    if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                        /*targetUniChar += data->currentDeltaToUnicode ;*/
                        *contextCharToUnicode= NO_CHAR_MARKER;
                        *toUnicodeStatus = missingCharMarker;
                        break;
                    }
                }
                GET_MAPPING(sourceChar,targetUniChar,data);
                *contextCharToUnicode = sourceChar;
                break;

            case ISCII_NUKTA:
                /* handle soft halant */
                if (*contextCharToUnicode == ISCII_HALANT) {
                    targetUniChar = ZWJ;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                    break;
                } else if (data->currentDeltaToUnicode == PNJ_DELTA && data->contextCharToUnicode == 0xc0) {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    /* We got here because ISCII_NUKTA was preceded by 0xc0 and we are converting Gurmukhi.
                     * In that case we must convert (0xc0 0xe9) to (\u0a5c\u0a4d\u0a39).
                     */
                    targetUniChar = PNJ_RRA;
                    WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                    if (U_SUCCESS(*err)) {
                        targetUniChar = PNJ_SIGN_VIRAMA;
                        WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                        if (U_SUCCESS(*err)) {
                            targetUniChar = PNJ_HA;
                            WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                        } else {
                            args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_HA;
                        }
                    } else {
                        args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_SIGN_VIRAMA;
                        args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_HA;
                    }
                    *toUnicodeStatus = missingCharMarker;
                    data->contextCharToUnicode = NO_CHAR_MARKER;
                    continue;
                } else {
                    /* try to handle <CHAR> + ISCII_NUKTA special mappings */
                    i=1;
                    found =FALSE;
                    for (; i<nuktaSpecialCases[0][0]; i++) {
                        if (nuktaSpecialCases[i][0]==(uint8_t)
                                *contextCharToUnicode) {
                            targetUniChar=nuktaSpecialCases[i][1];
                            found =TRUE;
                            break;
                        }
                    }
                    if (found) {
                        /* find out if the mapping is valid in this state */
                        if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                            /*targetUniChar += data->currentDeltaToUnicode ;*/
                            *contextCharToUnicode= NO_CHAR_MARKER;
                            *toUnicodeStatus = missingCharMarker;
                            if (data->currentDeltaToUnicode == PNJ_DELTA) {
                                /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                                if (data->prevToUnicodeStatus) {
                                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                                    data->prevToUnicodeStatus = 0x0000;
                                }
                                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);
                                continue;
                            }
                            break;
                        }
                        /* else fall through to default */
                    }
                    /* else fall through to default */
                    U_FALLTHROUGH;
                }
            default:GET_MAPPING(sourceChar,targetUniChar,data)
                ;
                *contextCharToUnicode = sourceChar;
                break;
            }

            if (*toUnicodeStatus != missingCharMarker) {
                /* Check to make sure that consonant clusters are handled correct for Gurmukhi script. */
                if (data->currentDeltaToUnicode == PNJ_DELTA && data->prevToUnicodeStatus != 0 && isPNJConsonant(data->prevToUnicodeStatus) &&
                        (*toUnicodeStatus + PNJ_DELTA) == PNJ_SIGN_VIRAMA && ((UChar32)(targetUniChar + PNJ_DELTA) == data->prevToUnicodeStatus)) {
                    /* Consonant clusters C + HALANT + C should be encoded as ADHAK + C */
                    offset = (int)(source-args->source - 3);
                    tempTargetUniChar = PNJ_ADHAK; /* This is necessary to avoid some compiler warnings. */
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,offset,tempTargetUniChar,0,err);
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,offset,data->prevToUnicodeStatus,0,err);
                    data->prevToUnicodeStatus = 0x0000; /* reset the previous unicode code point */
                    *toUnicodeStatus = missingCharMarker;
                    continue;
                } else {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    /* Check to make sure that Bindi and Tippi are handled correctly for Gurmukhi script. 
                     * If 0xA2 is preceded by a codepoint in the PNJ_BINDI_TIPPI_SET then the target codepoint should be Tippi instead of Bindi.
                     */
                    if (data->currentDeltaToUnicode == PNJ_DELTA && (targetUniChar + PNJ_DELTA) == PNJ_BINDI && isPNJBindiTippi((*toUnicodeStatus + PNJ_DELTA))) {
                        targetUniChar = PNJ_TIPPI - PNJ_DELTA;
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,PNJ_DELTA,err);
                    } else if (data->currentDeltaToUnicode == PNJ_DELTA && (targetUniChar + PNJ_DELTA) == PNJ_SIGN_VIRAMA && isPNJConsonant((*toUnicodeStatus + PNJ_DELTA))) {
                        /* Store the current toUnicodeStatus code point for later handling of consonant cluster in Gurmukhi. */
                        data->prevToUnicodeStatus = *toUnicodeStatus + PNJ_DELTA;
                    } else {
                        /* write the previously mapped codepoint */
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,data->currentDeltaToUnicode,err);
                    }
                }
                *toUnicodeStatus = missingCharMarker;
            }

            if (targetUniChar != missingCharMarker) {
                /* now save the targetUniChar for delayed write */
                *toUnicodeStatus = (UChar) targetUniChar;
                if (data->resetToDefaultToUnicode==TRUE) {
                    data->currentDeltaToUnicode = data->defDeltaToUnicode;
                    data->currentMaskToUnicode = data->defMaskToUnicode;
                    data->resetToDefaultToUnicode=FALSE;
                }
            } else {

                /* we reach here only if targetUniChar == missingCharMarker
                 * so assign codes to reason and err
                 */
                *err = U_INVALID_CHAR_FOUND;
CALLBACK:
                args->converter->toUBytes[0] = (uint8_t) sourceChar;
                args->converter->toULength = 1;
                break;
            }

        } else {
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    if (U_SUCCESS(*err) && args->flush && source == sourceLimit) {
        /* end of the input stream */
        UConverter *cnv = args->converter;

        if (*contextCharToUnicode==ATR || *contextCharToUnicode==EXT || *contextCharToUnicode==ISCII_INV) {
            /* set toUBytes[] */
            cnv->toUBytes[0] = (uint8_t)*contextCharToUnicode;
            cnv->toULength = 1;

            /* avoid looping on truncated sequences */
            *contextCharToUnicode = NO_CHAR_MARKER;
        } else {
            cnv->toULength = 0;
        }

        if (*toUnicodeStatus != missingCharMarker) {
            /* output a remaining target character */
            WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source - args->source -1),*toUnicodeStatus,data->currentDeltaToUnicode,err);
            *toUnicodeStatus = missingCharMarker;
        }
    }

    args->target = target;
    args->source = source;
}